

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_map.hpp
# Opt level: O0

void run<std::map<unsigned_int,double,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,double>>>,unsigned_int,double>
               (vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
                *A,vector<unsigned_int,_std::allocator<unsigned_int>_> *B_rows,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *B_cols,
               vector<double,_std::allocator<double>_> *B_values)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  pointer ppVar6;
  reference pvVar7;
  reference pvVar8;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
  *in_RDI;
  uint B_nnz_index;
  uint col_in_A;
  const_iterator it_1;
  size_t row_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> B_offsets;
  uint tmp;
  size_t row_1;
  uint offset;
  const_iterator it;
  size_t row;
  size_t i;
  size_t B_nnz;
  undefined4 in_stack_ffffffffffffff08;
  value_type in_stack_ffffffffffffff0c;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_> *in_stack_ffffffffffffff10;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_> *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  undefined4 in_stack_ffffffffffffff28;
  value_type vVar10;
  undefined4 in_stack_ffffffffffffff2c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  ulong uVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff60;
  _Self local_90;
  _Self local_88;
  ulong local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  value_type local_5c;
  ulong local_58;
  value_type local_4c;
  _Self local_48;
  _Self local_40;
  ulong local_38;
  ulong local_30;
  long local_28;
  vector<double,_std::allocator<double>_> *local_20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_10;
  vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
  *local_8;
  
  local_28 = 0;
  local_30 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    uVar11 = local_30;
    sVar4 = std::
            vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
            ::size(local_8);
    if (sVar4 <= uVar11) break;
    std::
    vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
    ::operator[](local_8,local_30);
    sVar5 = std::
            map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
            ::size((map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                    *)0x1043c3);
    local_28 = sVar5 + local_28;
    local_30 = local_30 + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff30,
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffff30,CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
            );
  std::
  vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
  ::size(local_8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff30,
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_38 = 0;
  while( true ) {
    uVar11 = local_38;
    sVar4 = std::
            vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
            ::size(local_8);
    if (sVar4 <= uVar11) break;
    std::
    vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
    ::operator[](local_8,local_38);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
         ::begin((map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    while( true ) {
      std::
      vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ::operator[](local_8,local_38);
      local_48._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
           ::end((map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      bVar3 = std::operator!=(&local_40,&local_48);
      pvVar9 = local_10;
      if (!bVar3) break;
      ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_> *)
                          0x1044f4);
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (pvVar9,(ulong)ppVar6->first);
      *pvVar7 = *pvVar7 + 1;
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_>::operator++
                (in_stack_ffffffffffffff10);
    }
    local_38 = local_38 + 1;
  }
  local_4c = 0;
  local_58 = 0;
  while( true ) {
    uVar11 = local_58;
    sVar4 = std::
            vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
            ::size(local_8);
    if (sVar4 <= uVar11) break;
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_10,local_58)
    ;
    local_5c = *pvVar7;
    vVar10 = local_4c;
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_10,local_58)
    ;
    *pvVar7 = vVar10;
    local_4c = local_5c + local_4c;
    local_58 = local_58 + 1;
  }
  pvVar9 = local_10;
  vVar10 = local_4c;
  sVar4 = std::
          vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
          ::size(local_8);
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvVar9,sVar4);
  *pvVar7 = vVar10;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_80 = 0;
  while( true ) {
    uVar11 = local_80;
    sVar4 = std::
            vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
            ::size(local_8);
    if (sVar4 <= uVar11) break;
    std::
    vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
    ::operator[](local_8,local_80);
    local_88._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
         ::begin((map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    while( true ) {
      std::
      vector<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>,_std::allocator<std::map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_>_>
      ::operator[](local_8,local_80);
      local_90._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
           ::end((map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      bVar3 = std::operator!=(&local_88,&local_90);
      if (!bVar3) break;
      ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_> *)
                          0x1046c1);
      uVar1 = ppVar6->first;
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_78,(ulong)uVar1);
      uVar2 = *pvVar7;
      in_stack_ffffffffffffff0c = (value_type)local_80;
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_18,(ulong)uVar2);
      *pvVar7 = in_stack_ffffffffffffff0c;
      ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_> *)
                          0x10470c);
      this = (_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_> *)ppVar6->second;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(ulong)uVar2);
      *pvVar8 = (value_type)this;
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_78,(ulong)uVar1);
      *pvVar7 = *pvVar7 + 1;
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_double>_>::operator++(this);
    }
    local_80 = local_80 + 1;
  }
  do_nothing(local_10,local_18,local_20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(pvVar9);
  return;
}

Assistant:

void run(std::vector<RowT> const & A,
         std::vector<IndexT> & B_rows,
         std::vector<IndexT> & B_cols,
         std::vector<NumericT> & B_values)
{
  std::size_t B_nnz = 0;

  for (std::size_t i = 0; i < A.size(); ++i)
    B_nnz += A[i].size();

  // initialize datastructures for B:
  B_cols.resize(B_nnz);    // note: initialization with zero not strictly required
  B_values.resize(B_nnz);  // note: initialization with zero not strictly required
  B_rows.resize(A.size() + 1);

  //
  // Stage 1: Compute nonzero pattern for B
  //
  for (std::size_t row = 0; row < A.size(); ++row)
  {
    for (typename RowT::const_iterator it = A[row].begin(); it != A[row].end(); ++it)
      B_rows[it->first] += 1;
  }

  // Bring row-start array in place using exclusive-scan:
  IndexT offset = 0;
  for (std::size_t row = 0; row < A.size(); ++row)
  {
    IndexT tmp = B_rows[row];
    B_rows[row] = offset;
    offset += tmp;
  }
  B_rows[A.size()] = offset;


  //
  // Stage 2: Fill with data
  //
  std::vector<IndexT> B_offsets(B_rows); // index of first unwritten element per row

  for (std::size_t row = 0; row < A.size(); ++row)
  {
    for (typename RowT::const_iterator it = A[row].begin(); it != A[row].end(); ++it)
    {
      IndexT col_in_A = it->first;
      IndexT B_nnz_index = B_offsets[col_in_A];
      B_cols[B_nnz_index] = row;
      B_values[B_nnz_index] = it->second;
      B_offsets[col_in_A] += 1;
    }
  }

  do_nothing(B_rows, B_cols, B_values);
}